

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O3

void __thiscall chrono::turtlebot::Turtlebot_PassiveWheel::Initialize(Turtlebot_PassiveWheel *this)

{
  double *pdVar1;
  ChFrame *pCVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ChSystem *pCVar5;
  long *plVar6;
  ChFrame<double> *this_00;
  double *pdVar7;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  double mmass;
  string vis_mesh_file;
  ChVector<double> principal_I;
  ChVector<double> mcog;
  ChFrame<double> X_GC;
  ChMatrix33<double> principal_inertia_rot;
  ChMatrix33<double> minertia;
  long *local_2a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a0;
  element_type *local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_290;
  double local_280;
  long *local_278 [2];
  long local_268 [2];
  ChVector<double> local_258;
  ChFrame<double> local_238;
  ChVector<double> local_1a8;
  undefined1 local_190 [136];
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  ChMatrix33<double> local_e8;
  ChMatrix33<double> local_a0;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                 "robot/turtlebot/",&(this->super_Turtlebot_Part).m_mesh_name);
  plVar6 = (long *)std::__cxx11::string::append((char *)local_190);
  pdVar1 = local_238.coord.pos.m_data + 1;
  pdVar7 = (double *)(plVar6 + 2);
  if ((double *)*plVar6 == pdVar7) {
    local_238.coord.pos.m_data[1] = *pdVar7;
    local_238.coord.pos.m_data[2] = (double)plVar6[3];
    local_238._vptr_ChFrame = (_func_int **)pdVar1;
  }
  else {
    local_238.coord.pos.m_data[1] = *pdVar7;
    local_238._vptr_ChFrame = (_func_int **)*plVar6;
  }
  local_238.coord.pos.m_data[0] = (double)plVar6[1];
  *plVar6 = (long)pdVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  chrono::GetChronoDataFile((string *)local_278);
  if (local_238._vptr_ChFrame != (_func_int **)pdVar1) {
    operator_delete(local_238._vptr_ChFrame,(long)local_238.coord.pos.m_data[1] + 1);
  }
  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)&local_2a8,SUB81(local_278,0),false);
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0;
  local_50 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  uStack_30 = 0;
  uStack_28 = 0;
  uStack_20 = 0;
  local_58 = 0x3ff0000000000000;
  uStack_38 = 0x3ff0000000000000;
  local_18 = 0x3ff0000000000000;
  (**(code **)(*local_2a8 + 0x80))();
  chrono::geometry::ChTriangleMeshConnected::RepairDuplicateVertexes(1e-09);
  local_1a8.m_data[0] = 0.0;
  local_1a8.m_data[1] = 0.0;
  local_1a8.m_data[2] = 0.0;
  chrono::geometry::ChTriangleMeshConnected::ComputeMassProperties
            ((bool)local_2a8._0_1_,(double *)0x1,(ChVector *)&local_280,(ChMatrix33 *)&local_1a8);
  local_258.m_data[0] = 0.0;
  local_258.m_data[1] = 0.0;
  local_258.m_data[2] = 0.0;
  ChInertiaUtils::PrincipalInertia(&local_a0,&local_258,&local_e8);
  pCVar2 = (ChFrame *)
           (this->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  ChFrame<double>::ChFrame(&local_238,&local_1a8,&local_e8);
  chrono::ChBodyAuxRef::SetFrame_COG_to_REF(pCVar2);
  chrono::ChVariablesBodyOwnMass::SetBodyMass(local_280 * (this->super_Turtlebot_Part).m_density);
  local_238.coord.pos.m_data[0] = (this->super_Turtlebot_Part).m_density;
  local_238.coord.pos.m_data[1] = local_238.coord.pos.m_data[0] * local_258.m_data[2];
  local_238._vptr_ChFrame = (_func_int **)(local_238.coord.pos.m_data[0] * local_258.m_data[0]);
  local_238.coord.pos.m_data[0] = local_238.coord.pos.m_data[0] * local_258.m_data[1];
  chrono::ChBody::SetInertiaXX
            ((this->super_Turtlebot_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this_00 = (ChFrame<double> *)
            (**(code **)(*(long *)(this->super_Turtlebot_Part).m_chassis.
                                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x1f0))();
  local_238._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  local_238.coord.pos.m_data[0] = (this->super_Turtlebot_Part).m_pos.m_data[0];
  local_238.coord.pos.m_data[1] = (this->super_Turtlebot_Part).m_pos.m_data[1];
  local_238.coord.pos.m_data[2] = (this->super_Turtlebot_Part).m_pos.m_data[2];
  local_238.coord.rot.m_data[0] = (this->super_Turtlebot_Part).m_rot.m_data[0];
  local_238.coord.rot.m_data[1] = (this->super_Turtlebot_Part).m_rot.m_data[1];
  local_238.coord.rot.m_data[2] = (this->super_Turtlebot_Part).m_rot.m_data[2];
  local_238.coord.rot.m_data[3] = (this->super_Turtlebot_Part).m_rot.m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_238.Amatrix,&(this->super_Turtlebot_Part).m_rot);
  ChFrame<double>::operator*((ChFrame<double> *)local_190,this_00,&local_238);
  chrono::ChBodyAuxRef::SetFrame_REF_to_abs
            ((ChFrame *)
             (this->super_Turtlebot_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  chrono::ChBody::SetBodyFixed
            (SUB81((this->super_Turtlebot_Part).m_body.
                   super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  Turtlebot_Part::AddCollisionShapes(&this->super_Turtlebot_Part);
  peVar3 = (this->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  plVar6 = *(long **)(peVar3 + 0x198);
  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar3 + 0x1a0);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar6 + 200))(plVar6,3);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  peVar3 = (this->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  plVar6 = *(long **)(peVar3 + 0x198);
  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar3 + 0x1a0);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar6 + 0xd8))(plVar6,1);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  Turtlebot_Part::AddVisualizationAssets(&this->super_Turtlebot_Part);
  local_298 = (this->super_Turtlebot_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Stack_290 = (this->super_Turtlebot_Part).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  pCVar5 = (this->super_Turtlebot_Part).m_system;
  p_Var4 = (this->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(pCVar5,&local_298);
  if (p_Stack_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_290);
  }
  if (local_2a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a0);
  }
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  return;
}

Assistant:

void Turtlebot_PassiveWheel::Initialize() {
    auto vis_mesh_file = GetChronoDataFile("robot/turtlebot/" + m_mesh_name + ".obj");
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(vis_mesh_file, false, false);
    trimesh->Transform(ChVector<>(0, 0, 0), ChMatrix33<>(1));  // scale to a different size
    trimesh->RepairDuplicateVertexes(1e-9);                    // if meshes are not watertight

    double mmass;
    ChVector<> mcog;
    ChMatrix33<> minertia;
    trimesh->ComputeMassProperties(true, mmass, mcog, minertia);
    ChMatrix33<> principal_inertia_rot;
    ChVector<> principal_I;
    ChInertiaUtils::PrincipalInertia(minertia, principal_I, principal_inertia_rot);

    m_body->SetFrame_COG_to_REF(ChFrame<>(mcog, principal_inertia_rot));

    // Set inertia
    m_body->SetMass(mmass * m_density);
    m_body->SetInertiaXX(m_density * principal_I);

    // set relative position to chassis
    const ChFrame<>& X_GP = m_chassis->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(m_pos, m_rot);                              // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                              // global -> child
    m_body->SetFrame_REF_to_abs(X_GC);
    m_body->SetBodyFixed(m_fixed);

    AddCollisionShapes();

    m_body->GetCollisionModel()->SetFamily(CollisionFamily::PASSIVE_WHEEL);
    m_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(CollisionFamily::CHASSIS);

    AddVisualizationAssets();

    m_system->Add(m_body);
}